

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_sse2.c
# Opt level: O2

void av1_calc_indices_dim2_sse2
               (int16_t *data,int16_t *centroids,uint8_t *indices,int64_t *total_dist,int n,int k)

{
  char cVar1;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int l;
  long lVar19;
  short *psVar20;
  int j;
  undefined4 uVar21;
  long lVar22;
  long lVar23;
  short sVar24;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98 [2];
  undefined4 uStack_94;
  short asStack_90 [2];
  undefined4 uStack_8c;
  short asStack_88 [4];
  __m128i ind [2];
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  undefined6 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [14];
  
  lVar16 = 0;
  uVar18 = 0;
  if (0 < k) {
    uVar18 = (ulong)(uint)k;
  }
  for (; uVar18 * 4 != lVar16; lVar16 = lVar16 + 4) {
    uVar21 = *(undefined4 *)((long)centroids + lVar16);
    *(undefined4 *)(local_98 + lVar16 * 2) = uVar21;
    (&uStack_94)[lVar16] = uVar21;
    *(undefined4 *)(asStack_90 + lVar16 * 2) = uVar21;
    *(undefined4 *)(asStack_88 + lVar16 * 2 + -2) = uVar21;
  }
  lVar16 = 0;
  lVar23 = 0;
  for (iVar17 = 0; iVar17 < n; iVar17 = iVar17 + 8) {
    for (lVar19 = 0; lVar19 != 2; lVar19 = lVar19 + 1) {
      sVar9 = *data;
      sVar10 = data[1];
      sVar11 = data[2];
      sVar12 = data[3];
      sVar13 = data[4];
      sVar14 = data[5];
      sVar15 = data[6];
      sVar24 = data[7];
      auVar30 = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(&local_b8 + lVar19 * 8) = (undefined1  [16])0x0;
      auVar33._0_2_ = sVar9 - local_98[0];
      auVar33._2_2_ = sVar10 - local_98[1];
      auVar33._4_2_ = sVar11 - (short)uStack_94;
      auVar33._6_2_ = sVar12 - uStack_94._2_2_;
      auVar33._8_2_ = sVar13 - asStack_90[0];
      auVar33._10_2_ = sVar14 - asStack_90[1];
      auVar33._12_2_ = sVar15 - (short)uStack_8c;
      auVar33._14_2_ = sVar24 - uStack_8c._2_2_;
      auVar29 = pmaddwd(auVar33,auVar33);
      lVar22 = 1;
      psVar20 = asStack_88;
      while( true ) {
        if (k <= lVar22) break;
        auVar32._0_2_ = sVar9 - *psVar20;
        auVar32._2_2_ = sVar10 - psVar20[1];
        auVar32._4_2_ = sVar11 - psVar20[2];
        auVar32._6_2_ = sVar12 - psVar20[3];
        auVar32._8_2_ = sVar13 - psVar20[4];
        auVar32._10_2_ = sVar14 - psVar20[5];
        auVar32._12_2_ = sVar15 - psVar20[6];
        auVar32._14_2_ = sVar24 - psVar20[7];
        auVar33 = pmaddwd(auVar32,auVar32);
        auVar34._0_4_ = -(uint)(auVar33._0_4_ < auVar29._0_4_);
        auVar34._4_4_ = -(uint)(auVar33._4_4_ < (int)auVar29._4_4_);
        auVar34._8_4_ = -(uint)(auVar33._8_4_ < (int)auVar29._8_4_);
        auVar34._12_4_ = -(uint)(auVar33._12_4_ < (int)auVar29._12_4_);
        uVar21 = (undefined4)lVar22;
        auVar31._4_4_ = uVar21;
        auVar31._0_4_ = uVar21;
        auVar31._8_4_ = uVar21;
        auVar31._12_4_ = uVar21;
        auVar29 = auVar33 & auVar34 | ~auVar34 & auVar29;
        auVar30 = auVar31 & auVar34 | ~auVar34 & auVar30;
        *(undefined1 (*) [16])(&local_b8 + lVar19 * 8) = auVar30;
        lVar22 = lVar22 + 1;
        psVar20 = psVar20 + 8;
      }
      if (total_dist != (int64_t *)0x0) {
        lVar16 = lVar16 + (auVar29._0_8_ & 0xffffffff) + (ulong)auVar29._8_4_;
        lVar23 = lVar23 + (ulong)auVar29._4_4_ + (ulong)auVar29._12_4_;
      }
      data = data + 8;
    }
    cVar1 = (0 < local_b8) * (local_b8 < 0x100) * (char)local_b8 - (0xff < local_b8);
    sVar24 = CONCAT11((0 < sStack_b6) * (sStack_b6 < 0x100) * (char)sStack_b6 - (0xff < sStack_b6),
                      cVar1);
    cVar2 = (0 < sStack_b4) * (sStack_b4 < 0x100) * (char)sStack_b4 - (0xff < sStack_b4);
    uVar21 = CONCAT13((0 < sStack_b2) * (sStack_b2 < 0x100) * (char)sStack_b2 - (0xff < sStack_b2),
                      CONCAT12(cVar2,sVar24));
    cVar3 = (0 < sStack_b0) * (sStack_b0 < 0x100) * (char)sStack_b0 - (0xff < sStack_b0);
    uVar25 = CONCAT15((0 < sStack_ae) * (sStack_ae < 0x100) * (char)sStack_ae - (0xff < sStack_ae),
                      CONCAT14(cVar3,uVar21));
    cVar4 = (0 < sStack_ac) * (sStack_ac < 0x100) * (char)sStack_ac - (0xff < sStack_ac);
    uVar26 = CONCAT17((0 < sStack_aa) * (sStack_aa < 0x100) * (char)sStack_aa - (0xff < sStack_aa),
                      CONCAT16(cVar4,uVar25));
    cVar5 = (0 < local_a8) * (local_a8 < 0x100) * (char)local_a8 - (0xff < local_a8);
    auVar27._0_10_ =
         CONCAT19((0 < sStack_a6) * (sStack_a6 < 0x100) * (char)sStack_a6 - (0xff < sStack_a6),
                  CONCAT18(cVar5,uVar26));
    cVar6 = (0 < sStack_a4) * (sStack_a4 < 0x100) * (char)sStack_a4 - (0xff < sStack_a4);
    auVar27[10] = cVar6;
    auVar27[0xb] = (0 < sStack_a2) * (sStack_a2 < 0x100) * (char)sStack_a2 - (0xff < sStack_a2);
    cVar7 = (0 < sStack_a0) * (sStack_a0 < 0x100) * (char)sStack_a0 - (0xff < sStack_a0);
    auVar28[0xc] = cVar7;
    auVar28._0_12_ = auVar27;
    auVar28[0xd] = (0 < sStack_9e) * (sStack_9e < 0x100) * (char)sStack_9e - (0xff < sStack_9e);
    cVar8 = (0 < sStack_9c) * (sStack_9c < 0x100) * (char)sStack_9c - (0xff < sStack_9c);
    auVar29[0xe] = cVar8;
    auVar29._0_14_ = auVar28;
    auVar29[0xf] = (0 < sStack_9a) * (sStack_9a < 0x100) * (char)sStack_9a - (0xff < sStack_9a);
    sVar9 = (short)((uint)uVar21 >> 0x10);
    sVar10 = (short)((uint6)uVar25 >> 0x20);
    sVar11 = (short)((ulong)uVar26 >> 0x30);
    sVar12 = (short)((unkuint10)auVar27._0_10_ >> 0x40);
    sVar13 = auVar27._10_2_;
    sVar14 = auVar28._12_2_;
    sVar15 = auVar29._14_2_;
    *(ulong *)indices =
         CONCAT17((0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15),
                  CONCAT16((0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14),
                           CONCAT15((0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13),
                                    CONCAT14((0 < sVar12) * (sVar12 < 0x100) * cVar5 -
                                             (0xff < sVar12),
                                             CONCAT13((0 < sVar11) * (sVar11 < 0x100) * cVar4 -
                                                      (0xff < sVar11),
                                                      CONCAT12((0 < sVar10) * (sVar10 < 0x100) *
                                                               cVar3 - (0xff < sVar10),
                                                               CONCAT11((0 < sVar9) *
                                                                        (sVar9 < 0x100) * cVar2 -
                                                                        (0xff < sVar9),
                                                                        (0 < sVar24) *
                                                                        (sVar24 < 0x100) * cVar1 -
                                                                        (0xff < sVar24))))))));
    indices = indices + 8;
  }
  if (total_dist != (int64_t *)0x0) {
    *total_dist = lVar23 + lVar16;
  }
  return;
}

Assistant:

void av1_calc_indices_dim2_sse2(const int16_t *data, const int16_t *centroids,
                                uint8_t *indices, int64_t *total_dist, int n,
                                int k) {
  const __m128i v_zero = _mm_setzero_si128();
  __m128i sum = _mm_setzero_si128();
  __m128i ind[2];
  __m128i cents[PALETTE_MAX_SIZE];
  for (int j = 0; j < k; ++j) {
    const int16_t cx = centroids[2 * j], cy = centroids[2 * j + 1];
    cents[j] = _mm_set_epi16(cy, cx, cy, cx, cy, cx, cy, cx);
  }

  for (int i = 0; i < n; i += 8) {
    for (int l = 0; l < 2; ++l) {
      const __m128i in = _mm_loadu_si128((__m128i *)data);
      ind[l] = _mm_setzero_si128();
      // Compute the distance to the first centroid.
      __m128i d1 = _mm_sub_epi16(in, cents[0]);
      __m128i dist_min = _mm_madd_epi16(d1, d1);

      for (int j = 1; j < k; ++j) {
        // Compute the distance to the centroid.
        d1 = _mm_sub_epi16(in, cents[j]);
        const __m128i dist = _mm_madd_epi16(d1, d1);
        // Compare to the minimal one.
        const __m128i cmp = _mm_cmpgt_epi32(dist_min, dist);
        const __m128i dist1 = _mm_andnot_si128(cmp, dist_min);
        const __m128i dist2 = _mm_and_si128(cmp, dist);
        dist_min = _mm_or_si128(dist1, dist2);
        const __m128i ind1 = _mm_set1_epi32(j);
        ind[l] = _mm_or_si128(_mm_andnot_si128(cmp, ind[l]),
                              _mm_and_si128(cmp, ind1));
      }
      if (total_dist) {
        // Convert to 64 bit and add to sum.
        const __m128i dist1 = _mm_unpacklo_epi32(dist_min, v_zero);
        const __m128i dist2 = _mm_unpackhi_epi32(dist_min, v_zero);
        sum = _mm_add_epi64(sum, dist1);
        sum = _mm_add_epi64(sum, dist2);
      }
      data += 8;
    }
    // Cast to 8 bit and store.
    const __m128i d2 = _mm_packus_epi16(ind[0], ind[1]);
    const __m128i d3 = _mm_packus_epi16(d2, v_zero);
    _mm_storel_epi64((__m128i *)indices, d3);
    indices += 8;
  }
  if (total_dist) {
    *total_dist = k_means_horizontal_sum_sse2(sum);
  }
}